

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChStream.cpp
# Opt level: O2

ChStreamInBinary * __thiscall chrono::ChStreamInBinary::operator>>(ChStreamInBinary *this,long *Val)

{
  long tmp;
  
  if ((this->super_ChBinaryArchive).big_endian_machine == true) {
    (*(this->super_ChStreamIn)._vptr_ChStreamIn[3])(this,&tmp,8);
    StreamSwapBytes<long>(&tmp);
    *Val = tmp;
  }
  else {
    (*(this->super_ChStreamIn)._vptr_ChStreamIn[3])(this,Val,8);
  }
  return this;
}

Assistant:

ChStreamInBinary& ChStreamInBinary::operator>>(long& Val) {
    if (big_endian_machine) {
        long tmp;
        this->Input((char*)&tmp, sizeof(long));
        StreamSwapBytes<long>(&tmp);
        Val = tmp;
    } else {
        this->Input((char*)&Val, sizeof(long));
    }
    return (*this);
}